

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopItemFlag(void)

{
  ImVector<int> *this;
  ImGuiWindow *pIVar1;
  ImGuiItemFlags IVar2;
  int *piVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  this = &(pIVar1->DC).ItemFlagsStack;
  ImVector<int>::pop_back(this);
  if ((pIVar1->DC).ItemFlagsStack.Size == 0) {
    IVar2 = 0;
  }
  else {
    piVar3 = ImVector<int>::back(this);
    IVar2 = *piVar3;
  }
  (pIVar1->DC).ItemFlags = IVar2;
  return;
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c < 0x10000)    // FIXME: Losing characters that don't fit in 2 bytes
            *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}